

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_find_set.cpp
# Opt level: O1

int __thiscall si9ma::UnionFindSet::find_header(UnionFindSet *this,int val)

{
  int iVar1;
  mapped_type *pmVar2;
  _Elt_pointer piVar3;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s_stack;
  int local_7c;
  _Deque_base<int,_std::allocator<int>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_7c = val;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_78,0);
  while (iVar1 = local_7c,
        pmVar2 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this,&local_7c), iVar1 != *pmVar2) {
    if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&local_78,&local_7c);
    }
    else {
      *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_7c;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_7c);
    local_7c = *pmVar2;
  }
  if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar1 = local_7c;
      piVar3 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar3 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,piVar3 + -1);
      *pmVar2 = iVar1;
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_78._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_78._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_78._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_78._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
    } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  iVar1 = local_7c;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_78);
  return iVar1;
}

Assistant:

int UnionFindSet::find_header(int val) {
        stack<int> s_stack;
        while (val != father_map[val]){
            s_stack.push(val);
            val = father_map[val];
        }

        while (!s_stack.empty()){
            father_map[s_stack.top()] = val;
            s_stack.pop();
        }

        return val;
    }